

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

put_transaction<void> * __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_start_dyn_push_copy
          (put_transaction<void> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,void *i_source)

{
  Allocation push_data;
  put_transaction<void> local_48;
  
  detail::
  LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ::try_inplace_allocate
            (&push_data,
             (LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
              *)this,i_progress_guarantee,1,true,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
             ).super__Tuple_impl<1UL,_density::f_destroy,_density::f_size,_density::f_alignment>.
             super__Tuple_impl<2UL,_density::f_size,_density::f_alignment>.
             super__Head_base<2UL,_density::f_size,_false>._M_head_impl.m_size,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
             ).super__Tuple_impl<1UL,_density::f_destroy,_density::f_size,_density::f_alignment>.
             super__Tuple_impl<2UL,_density::f_size,_density::f_alignment>.
             super__Tuple_impl<3UL,_density::f_alignment>.
             super__Head_base<3UL,_density::f_alignment,_false>._M_head_impl.m_alignment);
  if (push_data.m_user_storage == (void *)0x0) {
    local_48.m_queue =
         (lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          *)0x0;
    local_48.m_put.m_control_block = (LfQueueControl *)0x0;
    local_48.m_put.m_next_ptr = 0;
    (__return_storage_ptr__->m_put).m_user_storage = (void *)0x0;
    __return_storage_ptr__->m_queue =
         (lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          *)0x0;
    (__return_storage_ptr__->m_put).m_control_block = (LfQueueControl *)0x0;
    (__return_storage_ptr__->m_put).m_next_ptr = 0;
  }
  else {
    push_data.m_control_block[1].m_next = (uintptr_t)i_type->m_feature_table;
    runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
    ::copy_construct(i_type,push_data.m_user_storage,i_source);
    local_48.m_put.m_control_block = push_data.m_control_block;
    local_48.m_put.m_next_ptr = push_data.m_next_ptr;
    (__return_storage_ptr__->m_put).m_user_storage = push_data.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = push_data.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = push_data.m_next_ptr;
    __return_storage_ptr__->m_queue = this;
    local_48.m_queue = this;
  }
  local_48.m_put.m_user_storage = (void *)0x0;
  put_transaction<void>::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<> try_start_dyn_push_copy(
          progress_guarantee   i_progress_guarantee,
          const runtime_type & i_type,
          const void *         i_source)
        {
            auto push_data = try_inplace_allocate(
              i_progress_guarantee, detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());
            if (push_data.m_user_storage == nullptr)
            {
                return put_transaction<>();
            }

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.copy_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<void>(PrivateType(), this, push_data);
        }